

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O1

bool __thiscall input_mod::SetSubsong(input_mod *this,int order)

{
  DUH_SIGRENDERER *sigrenderer;
  bool bVar1;
  
  if (this->start_order == order) {
    bVar1 = false;
  }
  else {
    FCriticalSection::Enter(&this->crit_sec);
    sigrenderer = this->sr;
    this->sr = (DUH_SIGRENDERER *)0x0;
    this->start_order = order;
    bVar1 = open2(this,0);
    if (bVar1) {
      duh_end_sigrenderer(sigrenderer);
    }
    else {
      this->sr = sigrenderer;
    }
    FCriticalSection::Leave(&this->crit_sec);
  }
  return bVar1;
}

Assistant:

bool input_mod::SetSubsong(int order)
{
	if (order == start_order)
	{
		return false;
	}
	crit_sec.Enter();
	DUH_SIGRENDERER *oldsr = sr;
	sr = NULL;
	start_order = order;
	if (!open2(0))
	{
		sr = oldsr;
		crit_sec.Leave();
		return false;
	}
	duh_end_sigrenderer(oldsr);
	crit_sec.Leave();
	return true;
}